

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void getDWTRecCoeff(double *coeff,int *length,char *ctype,char *ext,int level,int J,double *lpr,
                   double *hpr,int lf,int siglength,double *reccoeff)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *__dest;
  int *piVar7;
  void *__ptr;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  
  __dest = malloc((long)siglength * 8 + 8);
  uVar3 = lf / 2;
  iVar4 = strcmp(ext,"per");
  if (iVar4 == 0) {
    iVar4 = strcmp(ctype,"appx");
    piVar7 = length + (long)(J - level) + 1;
    if (iVar4 == 0) {
      piVar7 = length;
    }
    uVar19 = (ulong)*piVar7;
    __ptr = malloc((long)((length[J] + lf) * 2) * 8 - 8);
    if (0 < (long)uVar19) {
      memcpy(__dest,coeff,uVar19 * 8);
    }
    if (0 < level) {
      iVar4 = strcmp(ctype,"det");
      uVar10 = (ulong)(uint)level;
      do {
        pdVar8 = lpr;
        if (iVar4 == 0) {
          pdVar8 = hpr;
        }
        if (uVar10 != (uint)level) {
          pdVar8 = lpr;
        }
        iVar5 = (int)uVar19;
        uVar6 = (uVar3 - 1) + iVar5;
        if (0 < (int)uVar6) {
          lVar14 = (long)iVar5;
          uVar19 = uVar19 & 0xffffffff;
          lVar18 = -1;
          lVar15 = -2;
          uVar13 = 0;
          do {
            *(undefined8 *)((long)__ptr + lVar15 * 8 + 0x10) = 0;
            lVar15 = lVar15 + 2;
            *(undefined8 *)((long)__ptr + lVar18 * 8 + 0x10) = 0;
            lVar18 = lVar18 + 2;
            if (1 < lf) {
              dVar20 = 0.0;
              lVar12 = 0;
              dVar21 = 0.0;
              lVar9 = 0;
              pdVar17 = pdVar8 + 1;
              do {
                lVar16 = uVar13 + lVar12;
                if ((lVar16 < 0) || (lVar14 <= lVar16)) {
                  if (lVar16 < lf + -1 + iVar5 && lVar14 <= lVar16) {
                    lVar16 = (uVar13 - lVar9) - lVar14;
                    goto LAB_00103930;
                  }
                  if ((lVar16 < 0) && ((int)-uVar3 < lVar16)) {
                    lVar16 = (long)((int)uVar19 + (int)lVar12);
                    goto LAB_00103930;
                  }
                }
                else {
LAB_00103930:
                  dVar1 = *(double *)((long)__dest + lVar16 * 8);
                  dVar21 = dVar21 + pdVar17[-1] * dVar1;
                  *(double *)((long)__ptr + lVar15 * 8) = dVar21;
                  dVar20 = dVar20 + dVar1 * *pdVar17;
                  *(double *)((long)__ptr + lVar18 * 8) = dVar20;
                }
                lVar9 = lVar9 + 1;
                lVar12 = lVar12 + -1;
                pdVar17 = pdVar17 + 2;
              } while (-lVar12 != (ulong)uVar3);
            }
            uVar13 = uVar13 + 1;
            uVar19 = uVar19 + 1;
          } while (uVar13 != uVar6);
        }
        if ((int)uVar3 <= (int)((uVar3 - 1) + iVar5 * 2)) {
          memcpy(__dest,(void *)((long)__ptr + (long)(int)uVar3 * 8 + -8),
                 (ulong)(iVar5 * 2 - 2) * 8 + 0x10);
        }
        if (uVar10 == 1) break;
        uVar19 = (ulong)(uint)length[((long)J - uVar10) + 2];
        bVar2 = 1 < (long)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar2);
    }
  }
  else {
    iVar4 = strcmp(ext,"sym");
    if (iVar4 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    iVar4 = strcmp(ctype,"appx");
    piVar7 = length + (long)(J - level) + 1;
    if (iVar4 == 0) {
      piVar7 = length;
    }
    uVar19 = (ulong)*piVar7;
    __ptr = malloc((long)((length[J] + lf) * 2 + -2) << 3);
    if (0 < (long)uVar19) {
      memcpy(__dest,coeff,uVar19 * 8);
    }
    if (0 < level) {
      iVar4 = strcmp(ctype,"det");
      iVar5 = lf + -2;
      uVar10 = (ulong)(uint)level;
      do {
        pdVar8 = lpr;
        if (iVar4 == 0) {
          pdVar8 = hpr;
        }
        if (uVar10 != (uint)level) {
          pdVar8 = lpr;
        }
        uVar6 = (uint)uVar19;
        if (0 < (int)uVar6) {
          lVar15 = -1;
          lVar14 = -2;
          uVar13 = 0;
          pvVar11 = __dest;
          do {
            *(undefined8 *)((long)__ptr + lVar14 * 8 + 0x10) = 0;
            lVar14 = lVar14 + 2;
            *(undefined8 *)((long)__ptr + lVar15 * 8 + 0x10) = 0;
            lVar15 = lVar15 + 2;
            if (1 < lf) {
              dVar20 = 0.0;
              lVar18 = 0;
              dVar21 = 0.0;
              pdVar17 = pdVar8 + 1;
              do {
                if ((uint)((int)uVar13 + (int)lVar18) < uVar6) {
                  dVar1 = *(double *)((long)pvVar11 + lVar18 * 8);
                  dVar21 = dVar21 + pdVar17[-1] * dVar1;
                  *(double *)((long)__ptr + lVar14 * 8) = dVar21;
                  dVar20 = dVar20 + dVar1 * *pdVar17;
                  *(double *)((long)__ptr + lVar15 * 8) = dVar20;
                }
                lVar18 = lVar18 + -1;
                pdVar17 = pdVar17 + 2;
              } while (-lVar18 != (ulong)uVar3);
            }
            uVar13 = uVar13 + 1;
            pvVar11 = (void *)((long)pvVar11 + 8);
          } while (uVar13 != (uVar19 & 0xffffffff));
        }
        if (SBORROW4(iVar5,uVar6 * 2) != (int)(iVar5 + uVar6 * -2) < 0) {
          memcpy((void *)((long)__dest + (long)iVar5 * 8 + (long)lf * -8 + 0x10),
                 (void *)((long)__ptr + (long)iVar5 * 8),(ulong)((uVar6 * 2 - lf) + 1) * 8 + 8);
        }
        if (uVar10 == 1) break;
        uVar19 = (ulong)(uint)length[((long)J - uVar10) + 2];
        bVar2 = 1 < (long)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar2);
    }
  }
  free(__ptr);
  if (0 < siglength) {
    memcpy(reccoeff,__dest,(ulong)(uint)siglength << 3);
  }
  free(__dest);
  return;
}

Assistant:

static void getDWTRecCoeff(double *coeff, int *length, const char *ctype, const char *ext, int level, int J, double *lpr,
	double *hpr, int lf, int siglength, double *reccoeff) {

	int i, j, k, det_len, N, l, m, n, v, t, l2;
	double *out, *X_lp, *filt;
	out = (double*)malloc(sizeof(double)* (siglength + 1));
	l2 = lf / 2;
	m = -2;
	n = -1;
	if (!strcmp(ext, "per")) {
		if (!strcmp((ctype), "appx")) {
			det_len = length[0];
		}
		else {
			det_len = length[J - level + 1];
		}

		N = 2 * length[J];

		X_lp = (double*)malloc(sizeof(double)* (N + 2 * lf - 1));

		for (i = 0; i < det_len; ++i) {
			out[i] = coeff[i];
		}

		for (j = level; j > 0; --j) {

			if (!strcmp((ctype), "det") && j == level) {
				filt = hpr;
			}
			else {
				filt = lpr;
			}

			m = -2;
			n = -1;

			for (i = 0; i < det_len + l2 - 1; ++i) {
				m += 2;
				n += 2;
				X_lp[m] = 0.0;
				X_lp[n] = 0.0;
				for (l = 0; l < l2; ++l) {
					t = 2 * l;
					if ((i - l) >= 0 && (i - l) < det_len) {
						X_lp[m] += filt[t] * out[i - l];
						X_lp[n] += filt[t + 1] * out[i - l];
					}
					else if ((i - l) >= det_len && (i - l) < det_len + lf - 1) {
						X_lp[m] += filt[t] * out[i - l - det_len];
						X_lp[n] += filt[t + 1] * out[i - l - det_len];
					}
					else if ((i - l) < 0 && (i - l) > -l2) {
						X_lp[m] += filt[t] * out[det_len + i - l];
						X_lp[n] += filt[t + 1] * out[det_len + i - l];
					}
				}
			}

			for (k = lf / 2 - 1; k < 2 * det_len + lf / 2 - 1; ++k) {
				out[k - lf / 2 + 1] = X_lp[k];
			}

			if (j != 1) {
				det_len = length[J - j + 2];
			}
		}

		free(X_lp);

	}
	else if (!strcmp(ext, "sym")) {
		if (!strcmp((ctype), "appx")) {
			det_len = length[0];
		}
		else {
			det_len = length[J - level + 1];
		}

		N = 2 * length[J] - 1;

		X_lp = (double*)malloc(sizeof(double)* (N + 2 * lf - 1));

		for (i = 0; i < det_len; ++i) {
			out[i] = coeff[i];
		}

		for (j = level; j > 0; --j) {

			if (!strcmp((ctype), "det") && j == level) {
				filt = hpr;
			}
			else {
				filt = lpr;
			}

			m = -2;
			n = -1;

			for (v = 0; v < det_len; ++v) {
				i = v;
				m += 2;
				n += 2;
				X_lp[m] = 0.0;
				X_lp[n] = 0.0;
				for (l = 0; l < lf / 2; ++l) {
					t = 2 * l;
					if ((i - l) >= 0 && (i - l) < det_len) {
						X_lp[m] += filt[t] * out[i - l];
						X_lp[n] += filt[t + 1] * out[i - l];
					}
				}
			}

			for (k = lf - 2; k < 2 * det_len; ++k) {
				out[k - lf + 2] = X_lp[k];
			}


			if (j != 1) {
				det_len = length[J - j + 2];
			}
		}

		free(X_lp);

	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	for (i = 0; i < siglength; ++i) {
		reccoeff[i] = out[i];
	}

	free(out);

}